

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

int canvas_isconnected(_glist *x,t_text *ob1,int n1,t_text *ob2,int n2)

{
  _outconnect *p_Var1;
  t_linetraverser t;
  
  linetraverser_start(&t,x);
  do {
    p_Var1 = linetraverser_next(&t);
    if (p_Var1 == (_outconnect *)0x0) {
      return 0;
    }
  } while ((((t.tr_ob != ob1) || (t.tr_outno != n1)) || (t.tr_ob2 != ob2)) || (t.tr_inno != n2));
  return 1;
}

Assistant:

int canvas_isconnected (t_canvas *x, t_text *ob1, int n1,
    t_text *ob2, int n2)
{
    t_linetraverser t;
    t_outconnect *oc;
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
        if (t.tr_ob == ob1 && t.tr_outno == n1 &&
            t.tr_ob2 == ob2 && t.tr_inno == n2)
                return (1);
    return (0);
}